

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatHeap.h
# Opt level: O2

void xSAT_HeapPercolateDown(xSAT_Heap_t *h,int i)

{
  int y;
  int iVar1;
  int y_00;
  int iVar2;
  Vec_Int_t *pVVar3;
  int i_00;
  
  y = Vec_IntEntry(h->vHeap,i);
  while( true ) {
    iVar2 = i * 2 + 1;
    pVVar3 = h->vHeap;
    if (pVVar3->nSize <= iVar2) break;
    i_00 = i * 2 + 2;
    if (i_00 < pVVar3->nSize) {
      iVar1 = Vec_IntEntry(pVVar3,i_00);
      y_00 = Vec_IntEntry(h->vHeap,iVar2);
      iVar1 = Compare(h,iVar1,y_00);
      if (iVar1 == 0) goto LAB_0071e145;
    }
    else {
LAB_0071e145:
      i_00 = iVar2;
    }
    iVar2 = Vec_IntEntry(h->vHeap,i_00);
    iVar2 = Compare(h,iVar2,y);
    pVVar3 = h->vHeap;
    if (iVar2 == 0) break;
    iVar2 = Vec_IntEntry(pVVar3,i_00);
    Vec_IntWriteEntry(pVVar3,i,iVar2);
    pVVar3 = h->vIndices;
    iVar2 = Vec_IntEntry(h->vHeap,i);
    Vec_IntWriteEntry(pVVar3,iVar2,i);
    i = i_00;
  }
  Vec_IntWriteEntry(pVVar3,i,y);
  Vec_IntWriteEntry(h->vIndices,y,i);
  return;
}

Assistant:

static inline void xSAT_HeapPercolateDown( xSAT_Heap_t * h, int i )
{
    int x = Vec_IntEntry( h->vHeap, i );

    while ( Left( i ) < Vec_IntSize( h->vHeap ) )
    {
        int child = Right( i ) < Vec_IntSize( h->vHeap ) &&
                    Compare( h, Vec_IntEntry( h->vHeap, Right( i ) ), Vec_IntEntry( h->vHeap, Left( i ) ) ) ?
                    Right( i ) : Left( i );

        if ( !Compare( h, Vec_IntEntry( h->vHeap, child ), x ) )
            break;

        Vec_IntWriteEntry( h->vHeap, i, Vec_IntEntry( h->vHeap, child ) );
        Vec_IntWriteEntry( h->vIndices, Vec_IntEntry( h->vHeap, i ), i );
        i = child;
    }
    Vec_IntWriteEntry( h->vHeap, i, x );
    Vec_IntWriteEntry( h->vIndices, x, i );
}